

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Lookup.cpp
# Opt level: O2

file_id * idx2::ConstructFilePath
                    (file_id *__return_storage_ptr__,idx2_file *Idx2,u64 Brick,i8 Level,i8 Subband,
                    i16 BpKey)

{
  uint uVar1;
  idx2_file *piVar2;
  ulong uVar3;
  file_id *pfVar4;
  int iVar5;
  ulong uVar6;
  char cVar7;
  byte bVar8;
  undefined7 in_register_00000009;
  int iVar9;
  long lVar10;
  char *pcVar11;
  long *in_FS_OFFSET;
  printer local_78;
  idx2_file *local_60;
  uint local_54;
  ulong local_50;
  char *local_48;
  file_id *local_40;
  long local_38;
  
  pcVar11 = (char *)(*in_FS_OFFSET + -0x100);
  local_60 = Idx2;
  printer::printer(&local_78,pcVar11,0x100);
  if ((FILE *)local_78.File == (FILE *)0x0 && local_78.Buf != (char *)0x0) {
    if ((long)local_78.Size < 2) {
      pcVar11 = "false && \"buffer too small\"";
    }
    else {
      iVar5 = snprintf(local_78.Buf,(long)local_78.Size,"%.*s/%s/%s/",
                       (ulong)(uint)(local_60->Dir).Size,(local_60->Dir).field_0.Ptr,local_60,
                       local_60->Field);
      local_78.Buf = local_78.Buf + iVar5;
      iVar9 = local_78.Size - iVar5;
      if (local_78.Size - iVar5 != 0 && iVar5 <= local_78.Size) goto LAB_00171f59;
      pcVar11 = "false && \"buffer overflow?\"";
    }
  }
  else {
    if ((local_78.Buf == (char *)0x0) && ((FILE *)local_78.File != (FILE *)0x0)) {
      fprintf((FILE *)local_78.File,"%.*s/%s/%s/",(ulong)(uint)(local_60->Dir).Size,
              (local_60->Dir).field_0.Ptr,local_60,local_60->Field);
      iVar9 = local_78.Size;
LAB_00171f59:
      local_78.Size = iVar9;
      if ((FILE *)local_78.File == (FILE *)0x0 && local_78.Buf != (char *)0x0) {
        if ((long)local_78.Size < 2) {
          pcVar11 = "false && \"buffer too small\"";
        }
        else {
          iVar5 = snprintf(local_78.Buf,(long)local_78.Size,"/L%02x",(ulong)(uint)(int)Level);
          local_78.Buf = local_78.Buf + iVar5;
          iVar9 = local_78.Size - iVar5;
          if (local_78.Size - iVar5 != 0 && iVar5 <= local_78.Size) goto LAB_00171fd0;
          pcVar11 = "false && \"buffer overflow?\"";
        }
      }
      else {
        if ((local_78.Buf == (char *)0x0) && ((FILE *)local_78.File != (FILE *)0x0)) {
          fprintf((FILE *)local_78.File,"/L%02x",(ulong)(uint)(int)Level);
          iVar9 = local_78.Size;
LAB_00171fd0:
          local_78.Size = iVar9;
          piVar2 = local_60;
          local_48 = pcVar11;
          local_40 = __return_storage_ptr__;
          if ('\x0f' < Level) {
            pcVar11 = 
            "t &idx2::stack_array<idx2::stack_array<signed char, 4>, 16>::operator[](int) const [t = idx2::stack_array<signed char, 4>, N = 16]"
            ;
LAB_001721fe:
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,pcVar11);
          }
          local_54 = (uint)CONCAT71(in_register_00000009,Level);
          lVar10 = (long)Level;
          uVar6 = 0;
          local_50 = Brick;
          local_38 = lVar10;
          while (pfVar4 = local_40, pcVar11 = local_48, uVar3 = local_50, uVar1 = local_54,
                uVar6 + 1 < (ulong)(piVar2->FilesDirsDepth).Arr[lVar10].Len) {
            if (uVar6 == 4) {
              pcVar11 = 
              "t &idx2::stack_array<signed char, 4>::operator[](int) const [t = signed char, N = 4]"
              ;
              goto LAB_001721fe;
            }
            cVar7 = (piVar2->FilesDirsDepth).Arr[lVar10].Arr[uVar6] -
                    (local_60->BricksOrderStr).Buffer.Data[lVar10 * 0x81 + 0x80];
            if ((FILE *)local_78.File == (FILE *)0x0 && local_78.Buf != (char *)0x0) {
              if ((long)local_78.Size < 2) {
                pcVar11 = "false && \"buffer too small\"";
              }
              else {
                bVar8 = -cVar7;
                iVar5 = snprintf(local_78.Buf,(long)local_78.Size,"/B%lx",
                                 ((Brick >> (bVar8 & 0x3f)) << (bVar8 & 0x3f)) >> (bVar8 & 0x3f));
                local_78.Buf = local_78.Buf + iVar5;
                iVar9 = local_78.Size - iVar5;
                if (local_78.Size - iVar5 != 0 && iVar5 <= local_78.Size) goto LAB_001720e0;
                pcVar11 = "false && \"buffer overflow?\"";
              }
LAB_00172221:
              uVar1 = 0x62;
              goto LAB_00172231;
            }
            if ((local_78.Buf != (char *)0x0) || ((FILE *)local_78.File == (FILE *)0x0)) {
              pcVar11 = "false && \"unavailable or ambiguous printer destination\"";
              goto LAB_00172221;
            }
            bVar8 = -cVar7;
            fprintf((FILE *)local_78.File,"/B%lx",
                    ((Brick >> (bVar8 & 0x3f)) << (bVar8 & 0x3f)) >> (bVar8 & 0x3f));
            iVar9 = local_78.Size;
LAB_001720e0:
            local_78.Size = iVar9;
            Brick = Brick << ((piVar2->FilesDirsDepth).Arr[lVar10].Arr[uVar6] & 0x3fU);
            uVar6 = uVar6 + 1;
          }
          if ((FILE *)local_78.File == (FILE *)0x0 && local_78.Buf != (char *)0x0) {
            if ((long)local_78.Size < 2) {
              pcVar11 = "false && \"buffer too small\"";
            }
            else {
              iVar5 = snprintf(local_78.Buf,(long)local_78.Size,".bin");
              local_78.Buf = local_78.Buf + iVar5;
              iVar9 = local_78.Size - iVar5;
              if (iVar9 != 0 && iVar5 <= local_78.Size) goto LAB_00172189;
              pcVar11 = "false && \"buffer overflow?\"";
            }
          }
          else {
            if ((local_78.Buf == (char *)0x0) && ((FILE *)local_78.File != (FILE *)0x0)) {
              fwrite(".bin",4,1,(FILE *)local_78.File);
              iVar9 = local_78.Size;
LAB_00172189:
              uVar6 = (ulong)(local_60->BricksPerFile).Arr[local_38];
              lVar10 = 0x3f;
              if (uVar6 != 0) {
                for (; uVar6 >> lVar10 == 0; lVar10 = lVar10 + -1) {
                }
              }
              bVar8 = -(uVar6 == 0) | (byte)lVar10;
              (pfVar4->Name).field_0.Ptr = pcVar11;
              (pfVar4->Name).Size = iVar9;
              pfVar4->Id = (uVar3 >> ((1L << (bVar8 & 0x3f) != uVar6) + bVar8 & 0x3f)) * 0x40000 +
                           ((ulong)(uVar1 & 0xff) << 0x3c);
              return pfVar4;
            }
            pcVar11 = "false && \"unavailable or ambiguous printer destination\"";
          }
          uVar1 = 99;
          goto LAB_00172231;
        }
        pcVar11 = "false && \"unavailable or ambiguous printer destination\"";
      }
      uVar1 = 0x61;
      goto LAB_00172231;
    }
    pcVar11 = "false && \"unavailable or ambiguous printer destination\"";
  }
  uVar1 = 0x60;
LAB_00172231:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                ,uVar1,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
}

Assistant:

file_id
ConstructFilePath(const idx2_file& Idx2, u64 Brick, i8 Level, i8 Subband, i16 BpKey)
{
  //i16 BpFileKey = (BpKey * Idx2.BitPlanesPerChunk) / Idx2.BitPlanesPerFile;
#define idx2_PrintLevel idx2_Print(&Pr, "/L%02x", Level);
#define idx2_PrintBrick                                                                            \
  for (int Depth = 0; Depth + 1 < Idx2.FilesDirsDepth[Level].Len; ++Depth)                         \
  {                                                                                                \
    int BitLen =                                                                                   \
      idx2_BitSizeOf(u64) - Idx2.BricksOrderStr[Level].Len + Idx2.FilesDirsDepth[Level][Depth];    \
    idx2_Print(&Pr, "/B%" PRIx64, TakeFirstBits(Brick, BitLen));                                   \
    Brick <<= Idx2.FilesDirsDepth[Level][Depth];                                                   \
    Shift += Idx2.FilesDirsDepth[Level][Depth];                                                    \
  }
#define idx2_PrintExtension idx2_Print(&Pr, ".bin");
  u64 BrickBackup = Brick;
  int Shift = 0;
  thread_local static char FilePath[256];
  printer Pr(FilePath, sizeof(FilePath));
  idx2_Print(&Pr, "%.*s/%s/%s/", Idx2.Dir.Size, Idx2.Dir.ConstPtr, Idx2.Name, Idx2.Field);
  idx2_PrintLevel;
  idx2_PrintBrick;
  idx2_PrintExtension;
  u64 FileId = GetFileAddress(Idx2, BrickBackup, Level, Subband, BpKey);
  return file_id{ stref{ FilePath, Pr.Size }, FileId };
#undef idx2_PrintLevel
#undef idx2_PrintBrick
#undef idx2_PrintSubband
#undef idx2_PrintBitPlane
#undef idx2_PrintExtension
}